

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbpl_fifo.h
# Opt level: O0

int __thiscall
sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d>::remove
          (sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *this,char *__filename)

{
  uint uVar1;
  undefined1 local_1;
  sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *psVar2;
  
  if (this->head_ == this->tail_) {
    uVar1 = printf("ERROR: Trying to remove when FIFO is empty!\n");
    psVar2 = (sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *)(ulong)uVar1;
    local_1 = 0;
  }
  else {
    *(bfs_cell_2d *)__filename = this->q_[this->tail_];
    this->tail_ = this->tail_ + 1;
    psVar2 = (sbpl_fifo<sbpl_bfs_2d::bfs_cell_2d> *)(ulong)(uint)this->tail_;
    if (this->tail_ == this->size_) {
      this->tail_ = 0;
      psVar2 = this;
    }
    local_1 = 1;
  }
  return (int)CONCAT71((int7)((ulong)psVar2 >> 8),local_1);
}

Assistant:

bool remove(T* val)
    {
        if (head_ == tail_) {
            printf("ERROR: Trying to remove when FIFO is empty!\n");
            return false;
        }
        *val = q_[tail_];
        tail_++;
        if (tail_ == size_) tail_ = 0;
        return true;
    }